

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int skip_to_end_of_word_and_terminate(char **ppw,int eol)

{
  byte bVar1;
  ushort uVar2;
  char *pcVar3;
  ushort **ppuVar4;
  byte *pbVar5;
  
  ppuVar4 = __ctype_b_loc();
  pbVar5 = (byte *)*ppw;
  bVar1 = *pbVar5;
  uVar2 = (*ppuVar4)[bVar1];
  while ((short)uVar2 < 0) {
    pbVar5 = pbVar5 + 1;
    *ppw = (char *)pbVar5;
    bVar1 = *pbVar5;
    uVar2 = (*ppuVar4)[bVar1];
  }
  if (eol == 0) {
    if (bVar1 != 0x20) {
      return -1;
    }
  }
  else if ((bVar1 != 10) && (bVar1 != 0xd)) {
    return -1;
  }
  do {
    *pbVar5 = 0;
    pcVar3 = *ppw;
    pbVar5 = (byte *)(pcVar3 + 1);
    *ppw = (char *)pbVar5;
  } while (((*ppuVar4)[(byte)pcVar3[1]] >> 0xd & 1) != 0);
  return -(uint)(-1 < (short)(*ppuVar4)[(byte)pcVar3[1]] && eol == 0) | 1;
}

Assistant:

static int
skip_to_end_of_word_and_terminate(char **ppw, int eol)
{
	/* Forward until a space is found - use isgraph here */
	/* See http://www.cplusplus.com/reference/cctype/ */
	while (isgraph((unsigned char)**ppw)) {
		(*ppw)++;
	}

	/* Check end of word */
	if (eol) {
		/* must be a end of line */
		if ((**ppw != '\r') && (**ppw != '\n')) {
			return -1;
		}
	} else {
		/* must be a end of a word, but not a line */
		if (**ppw != ' ') {
			return -1;
		}
	}

	/* Terminate and forward to the next word */
	do {
		**ppw = 0;
		(*ppw)++;
	} while (isspace((unsigned char)**ppw));

	/* Check after term */
	if (!eol) {
		/* if it's not the end of line, there must be a next word */
		if (!isgraph((unsigned char)**ppw)) {
			return -1;
		}
	}

	/* ok */
	return 1;
}